

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_xbm.c
# Opt level: O3

void gdImageXbmCtx(gdImagePtr image,char *file_name,int fg,gdIOCtx *out)

{
  int iVar1;
  _func_int_gdIOCtx_ptr_void_ptr_int *p_Var2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  size_t sVar8;
  ushort **ppuVar9;
  size_t sVar10;
  uint uVar11;
  int x;
  uint uVar12;
  uint uVar13;
  int local_58;
  int local_54;
  
  pcVar5 = strrchr(file_name,0x2f);
  pcVar7 = pcVar5 + 1;
  if (pcVar5 == (char *)0x0) {
    pcVar7 = file_name;
  }
  pcVar6 = strrchr(pcVar7,0x5c);
  pcVar5 = pcVar6 + 1;
  if (pcVar6 == (char *)0x0) {
    pcVar5 = pcVar7;
  }
  pcVar5 = strdup(pcVar5);
  pcVar7 = strrchr(pcVar5,0x2e);
  if ((pcVar7 != (char *)0x0) && (iVar3 = strcasecmp(pcVar7,".XBM"), iVar3 == 0)) {
    *pcVar7 = '\0';
  }
  sVar8 = strlen(pcVar5);
  if (sVar8 == 0) {
    free(pcVar5);
    pcVar5 = strdup("image");
  }
  else {
    sVar10 = 0;
    ppuVar9 = __ctype_b_loc();
    do {
      if ((*(byte *)((long)*ppuVar9 + (long)pcVar5[sVar10] * 2 + 1) & 0xb) == 0) {
        pcVar5[sVar10] = '_';
      }
      sVar10 = sVar10 + 1;
    } while (sVar8 != sVar10);
  }
  (*out->putBuf)(out,"#define ",8);
  p_Var2 = out->putBuf;
  sVar8 = strlen(pcVar5);
  (*p_Var2)(out,pcVar5,(int)sVar8);
  (*out->putBuf)(out,"_width ",7);
  local_54 = 0;
  gdCtxPrintf(out,"%d\n",(ulong)(uint)image->sx);
  (*out->putBuf)(out,"#define ",8);
  p_Var2 = out->putBuf;
  sVar8 = strlen(pcVar5);
  (*p_Var2)(out,pcVar5,(int)sVar8);
  (*out->putBuf)(out,"_height ",8);
  gdCtxPrintf(out,"%d\n",(ulong)(uint)image->sy);
  (*out->putBuf)(out,"static unsigned char ",0x15);
  p_Var2 = out->putBuf;
  sVar8 = strlen(pcVar5);
  (*p_Var2)(out,pcVar5,(int)sVar8);
  (*out->putBuf)(out,"_bits[] = {\n  ",0xe);
  free(pcVar5);
  iVar3 = image->sy;
  if (0 < iVar3) {
    iVar1 = image->sx;
    uVar11 = 1;
    local_58 = 0;
    uVar13 = 0;
    do {
      if (0 < iVar1) {
        x = 0;
        do {
          iVar4 = gdImageGetPixel(image,x,local_58);
          uVar12 = uVar11;
          if (iVar4 != fg) {
            uVar12 = 0;
          }
          uVar13 = uVar12 | uVar13;
          if (x - iVar1 == -1 || uVar11 == 0x80) {
            iVar4 = 0;
            if ((local_54 != 0) &&
               ((*out->putBuf)(out,", ",2), iVar4 = local_54,
               (local_54 * -0x55555555 + 0x2aaaaaa8U >> 2 | local_54 * -0x40000000) < 0x15555555)) {
              (*out->putBuf)(out,"\n  ",3);
              iVar4 = 0xc;
            }
            local_54 = iVar4 + 1;
            gdCtxPrintf(out,"0x%02X",(ulong)uVar13);
            uVar11 = 1;
            uVar13 = 0;
          }
          else {
            uVar11 = uVar11 * 2;
          }
          x = x + 1;
        } while (x != iVar1);
      }
      local_58 = local_58 + 1;
    } while (local_58 != iVar3);
  }
  (*out->putBuf)(out,"};\n",3);
  return;
}

Assistant:

BGD_DECLARE(void) gdImageXbmCtx(gdImagePtr image, char* file_name, int fg, gdIOCtx * out)
{
	int x, y, c, b, sx, sy, p;
	char *name, *f;
	size_t i, l;

	name = file_name;
	if ((f = strrchr(name, '/')) != NULL) name = f+1;
	if ((f = strrchr(name, '\\')) != NULL) name = f+1;
	name = strdup(name);
	if ((f = strrchr(name, '.')) != NULL && !strcasecmp(f, ".XBM")) *f = '\0';
	if ((l = strlen(name)) == 0) {
		free(name);
		name = strdup("image");
	} else {
		for (i=0; i<l; i++) {
			/* only in C-locale isalnum() would work */
			if (!isupper(name[i]) && !islower(name[i]) && !isdigit(name[i])) {
				name[i] = '_';
			}
		}
	}

	/* Since "name" comes from the user, run it through a direct puts.
	 * Trying to printf it into a local buffer means we'd need a large
	 * or dynamic buffer to hold it all. */

	/* #define <name>_width 1234 */
	gdCtxPuts(out, "#define ");
	gdCtxPuts(out, name);
	gdCtxPuts(out, "_width ");
	gdCtxPrintf(out, "%d\n", gdImageSX(image));

	/* #define <name>_height 1234 */
	gdCtxPuts(out, "#define ");
	gdCtxPuts(out, name);
	gdCtxPuts(out, "_height ");
	gdCtxPrintf(out, "%d\n", gdImageSY(image));

	/* static unsigned char <name>_bits[] = {\n */
	gdCtxPuts(out, "static unsigned char ");
	gdCtxPuts(out, name);
	gdCtxPuts(out, "_bits[] = {\n  ");

	free(name);

	b = 1;
	p = 0;
	c = 0;
	sx = gdImageSX(image);
	sy = gdImageSY(image);
	for (y = 0; y < sy; y++) {
		for (x = 0; x < sx; x++) {
			if (gdImageGetPixel(image, x, y) == fg) {
				c |= b;
			}
			if ((b == 128) || (x == sx - 1)) {
				b = 1;
				if (p) {
					gdCtxPuts(out, ", ");
					if (!(p%12)) {
						gdCtxPuts(out, "\n  ");
						p = 12;
					}
				}
				p++;
				gdCtxPrintf(out, "0x%02X", c);
				c = 0;
			} else {
				b <<= 1;
			}
		}
	}
	gdCtxPuts(out, "};\n");
}